

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O1

void __thiscall
mahjong::PatternComputer::compute
          (PatternComputer *this,WiningPatterns *out_patterns,WiningHand *out_wining_hand)

{
  pointer puVar1;
  unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_> *it;
  pointer puVar2;
  pointer hand;
  WiningHandCollator c;
  WiningHands local_90;
  vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_> local_78;
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  local_60;
  
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::clear(&(this->highest_patterns)._M_t);
  local_78.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  WiningHandCollator::collate(&local_90,(WiningHandCollator *)&local_78,this->hand);
  if (local_90.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_90.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    hand = local_90.super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>.
           _M_impl.super__Vector_impl_data._M_start;
    do {
      puVar1 = (this->recognizers).
               super__Vector_base<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar2 = (this->recognizers).
                    super__Vector_base<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1
          ) {
        (*((puVar2->_M_t).
           super___uniq_ptr_impl<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>
           ._M_t.
           super__Tuple_impl<0UL,_mahjong::PatternRecognizer_*,_std::default_delete<mahjong::PatternRecognizer>_>
           .super__Head_base<0UL,_mahjong::PatternRecognizer_*,_false>._M_head_impl)->
          _vptr_PatternRecognizer[2])();
      }
      check(this,hand);
      recognize((WiningPatterns *)&local_60,this);
      setHighest(this,hand,(WiningPatterns *)&local_60);
      std::
      _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
      ::~_Rb_tree(&local_60);
      hand = hand + 1;
    } while (hand != local_90.
                     super__Vector_base<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>::~vector(&local_90);
  special(this,this->hand);
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::operator=(&out_patterns->_M_t,&(this->highest_patterns)._M_t);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::operator=
            (&out_wining_hand->pairs,&(this->highest_wining_hand).pairs);
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::operator=
            (&out_wining_hand->melds,&(this->highest_wining_hand).melds);
  std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::operator=
            (&out_wining_hand->tiles,&(this->highest_wining_hand).tiles);
  out_wining_hand->last_tile = (this->highest_wining_hand).last_tile;
  std::vector<mahjong::WiningHand,_std::allocator<mahjong::WiningHand>_>::~vector(&local_78);
  return;
}

Assistant:

void PatternComputer::compute(WiningPatterns& out_patterns, WiningHand& out_wining_hand)
{
	highest_patterns.clear();

	WiningHandCollator c;
	for (const auto& h : c.collate(hand))
	{
		resetRecognizer();

		check(h);

		const auto& patterns = recognize();
		setHighest(h, patterns);
	}

	special(hand);

	out_patterns = highest_patterns;
	out_wining_hand = highest_wining_hand;
}